

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  undefined8 *puVar1;
  size_type sVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  pointer pNVar6;
  bitwidth_t bVar7;
  undefined4 uVar8;
  size_type sVar9;
  pointer pNVar10;
  pointer pNVar11;
  long lVar12;
  pointer pNVar13;
  long lVar14;
  ulong capacity;
  
  pNVar13 = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = this->len + 1;
    uVar3 = this->cap;
    if (capacity < uVar3 * 2) {
      capacity = uVar3 * 2;
    }
    if (0x7fffffffffffffff - uVar3 < uVar3) {
      capacity = 0x7fffffffffffffff;
    }
    lVar14 = (long)pNVar13 - (long)this->data_;
    pNVar10 = (pointer)detail::allocArray(capacity,0x10);
    uVar5 = *(undefined8 *)&args->width;
    *(undefined8 *)((long)pNVar10 + lVar14) = args->netType;
    ((undefined8 *)((long)pNVar10 + lVar14))[1] = uVar5;
    pNVar11 = this->data_;
    sVar2 = this->len;
    pNVar6 = pNVar10;
    if (pNVar11 + sVar2 == pNVar13) {
      if (sVar2 != 0) {
        lVar12 = 0;
        do {
          puVar4 = (undefined8 *)((long)&pNVar11->netType + lVar12);
          uVar5 = puVar4[1];
          puVar1 = (undefined8 *)((long)&pNVar10->netType + lVar12);
          *puVar1 = *puVar4;
          puVar1[1] = uVar5;
          lVar12 = lVar12 + 0x10;
        } while (sVar2 * 0x10 != lVar12);
      }
    }
    else {
      for (; pNVar11 != pNVar13; pNVar11 = pNVar11 + 1) {
        bVar7 = pNVar11->width;
        uVar8 = *(undefined4 *)&pNVar11->field_0xc;
        pNVar6->netType = pNVar11->netType;
        pNVar6->width = bVar7;
        *(undefined4 *)&pNVar6->field_0xc = uVar8;
        pNVar6 = pNVar6 + 1;
      }
      sVar2 = this->len;
      pNVar11 = this->data_;
      if (pNVar11 + sVar2 != pNVar13) {
        puVar4 = (undefined8 *)((long)pNVar10 + lVar14);
        do {
          uVar5 = *(undefined8 *)&pNVar13->width;
          puVar4[2] = pNVar13->netType;
          puVar4[3] = uVar5;
          pNVar13 = pNVar13 + 1;
          puVar4 = puVar4 + 2;
        } while (pNVar13 != pNVar11 + sVar2);
      }
    }
    if (this->data_ != (pointer)this->firstElement) {
      free(this->data_);
    }
    this->len = this->len + 1;
    this->cap = capacity;
    this->data_ = pNVar10;
    return (reference)((long)pNVar10 + lVar14);
  }
  bVar7 = args->width;
  uVar8 = *(undefined4 *)&args->field_0xc;
  pNVar13->netType = args->netType;
  pNVar13->width = bVar7;
  *(undefined4 *)&pNVar13->field_0xc = uVar8;
  sVar2 = this->len;
  sVar9 = sVar2 + 1;
  this->len = sVar9;
  if (sVar9 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::back() [T = slang::ast::PortSymbol::NetTypeRange]"
              );
  }
  return this->data_ + sVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }